

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

u32 crc32_slice8(u32 remainder,u8 *buffer,size_t size)

{
  uint uVar1;
  uint uVar2;
  u8 *puVar3;
  u8 *puVar4;
  u32 v2;
  u32 v1;
  u8 *end64;
  u8 *end;
  u8 *p;
  size_t size_local;
  u8 *buffer_local;
  u32 remainder_local;
  
  puVar3 = buffer + size;
  remainder_local = remainder;
  for (p = buffer; ((ulong)p & 7) != 0 && p != puVar3; p = p + 1) {
    remainder_local = remainder_local >> 8 ^ crc32_table[(int)(remainder_local & 0xff ^ (uint)*p)];
  }
  puVar4 = p + ((long)puVar3 - (long)p & 0xfffffffffffffff8);
  for (; p != puVar4; p = p + 8) {
    uVar1 = *(uint *)p;
    uVar2 = *(uint *)(p + 4);
    remainder_local =
         crc32_table[(int)(((remainder_local ^ uVar1) & 0xff) + 0x700)] ^
         crc32_table[(int)(((remainder_local ^ uVar1) >> 8 & 0xff) + 0x600)] ^
         crc32_table[(int)(((remainder_local ^ uVar1) >> 0x10 & 0xff) + 0x500)] ^
         crc32_table[(int)(((remainder_local ^ uVar1) >> 0x18) + 0x400)] ^
         crc32_table[(int)((uVar2 & 0xff) + 0x300)] ^
         crc32_table[(int)((uVar2 >> 8 & 0xff) + 0x200)] ^
         crc32_table[(int)((uVar2 >> 0x10 & 0xff) + 0x100)] ^ crc32_table[(int)(uVar2 >> 0x18)];
  }
  for (; p != puVar3; p = p + 1) {
    remainder_local = remainder_local >> 8 ^ crc32_table[(int)(remainder_local & 0xff ^ (uint)*p)];
  }
  return remainder_local;
}

Assistant:

static u32
crc32_slice8(u32 remainder, const u8 *buffer, size_t size)
{
	const u8 *p = buffer;
	const u8 *end = buffer + size;
	const u8 *end64;

	STATIC_ASSERT(ARRAY_LEN(crc32_table) >= 0x800);

	for (; ((uintptr_t)p & 7) && p != end; p++)
		remainder = crc32_update_byte(remainder, *p);

	end64 = p + ((end - p) & ~7);
	for (; p != end64; p += 8) {
		u32 v1 = le32_bswap(*(const u32 *)(p + 0));
		u32 v2 = le32_bswap(*(const u32 *)(p + 4));
		remainder =
		    crc32_table[0x700 + (u8)((remainder ^ v1) >>  0)] ^
		    crc32_table[0x600 + (u8)((remainder ^ v1) >>  8)] ^
		    crc32_table[0x500 + (u8)((remainder ^ v1) >> 16)] ^
		    crc32_table[0x400 + (u8)((remainder ^ v1) >> 24)] ^
		    crc32_table[0x300 + (u8)(v2 >>  0)] ^
		    crc32_table[0x200 + (u8)(v2 >>  8)] ^
		    crc32_table[0x100 + (u8)(v2 >> 16)] ^
		    crc32_table[0x000 + (u8)(v2 >> 24)];
	}

	for (; p != end; p++)
		remainder = crc32_update_byte(remainder, *p);

	return remainder;
}